

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::tls12_add_verify_sigalgs(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  unsigned_short *puVar4;
  bool bVar5;
  
  sVar2 = (hs->config->verify_sigalgs).size_;
  if (sVar2 == 0) {
    puVar4 = &kVerifySignatureAlgorithms;
    sVar2 = 9;
  }
  else {
    puVar4 = (hs->config->verify_sigalgs).data_;
  }
  lVar3 = 0;
  do {
    iVar1 = CBB_add_u16(out,*(uint16_t *)((long)puVar4 + lVar3));
    if (iVar1 == 0) break;
    bVar5 = sVar2 * 2 + -2 != lVar3;
    lVar3 = lVar3 + 2;
  } while (bVar5);
  return iVar1 != 0;
}

Assistant:

bool tls12_add_verify_sigalgs(const SSL_HANDSHAKE *hs, CBB *out) {
  for (uint16_t sigalg : tls12_get_verify_sigalgs(hs)) {
    if (!CBB_add_u16(out, sigalg)) {
      return false;
    }
  }
  return true;
}